

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_SecureChannel_detachSession(UA_SecureChannel *channel,UA_Session *session)

{
  SessionEntry *local_20;
  SessionEntry *se;
  UA_Session *session_local;
  UA_SecureChannel *channel_local;
  
  if (session != (UA_Session *)0x0) {
    session->channel = (UA_SecureChannel *)0x0;
  }
  for (local_20 = (channel->sessions).lh_first;
      (local_20 != (SessionEntry *)0x0 && (local_20->session != session));
      local_20 = (local_20->pointers).le_next) {
  }
  if (local_20 != (SessionEntry *)0x0) {
    if ((local_20->pointers).le_next != (SessionEntry *)0x0) {
      (((local_20->pointers).le_next)->pointers).le_prev = (local_20->pointers).le_prev;
    }
    *(local_20->pointers).le_prev = (local_20->pointers).le_next;
    free(local_20);
  }
  return;
}

Assistant:

void UA_SecureChannel_detachSession(UA_SecureChannel *channel, UA_Session *session) {
    if(session)
        session->channel = NULL;
    struct SessionEntry *se;
    LIST_FOREACH(se, &channel->sessions, pointers) {
        if(se->session == session)
            break;
    }
    if(!se)
        return;
    LIST_REMOVE(se, pointers);
    UA_free(se);
}